

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefAST *node_,
          int expecting_,bool matchNot)

{
  char *pcVar1;
  AST *pAVar2;
  allocator<char> *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  Token *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  RecognitionException *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffff7c;
  uint nbits;
  BitSet *in_stack_ffffffffffffff80;
  undefined1 local_49 [36];
  byte local_25;
  undefined4 local_24;
  undefined4 local_14;
  undefined8 local_10;
  
  local_25 = in_R9B & 1;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  local_24 = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,in_RCX);
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  *(undefined ***)in_RDI = &PTR__MismatchedTokenException_004fbb38;
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff40,
             (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff38);
  pcVar1 = in_RDI + 0x60;
  nbits = CONCAT22((short)((uint)in_stack_ffffffffffffff7c >> 0x10),
                   (ushort)(byte)in_stack_ffffffffffffff7c);
  pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)in_RCX);
  if (pAVar2 == (AST *)0x0) {
    std::allocator<char>::allocator();
    nbits = CONCAT22((short)(nbits >> 0x10),CONCAT11(1,(char)nbits));
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,in_RCX);
  }
  else {
    pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RCX);
    (*pAVar2->_vptr_AST[0x18])(pcVar1);
  }
  if ((nbits & 0x100) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7e);
  }
  *(uint *)(in_RDI + 0x80) = (local_25 & 1) + 1;
  *(undefined4 *)(in_RDI + 0x84) = local_24;
  BitSet::BitSet(in_stack_ffffffffffffff80,nbits);
  *(undefined8 *)(in_RDI + 0xb8) = local_10;
  *(undefined4 *)(in_RDI + 0xc0) = local_14;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefAST node_,
	int expecting_,
	bool matchNot
) : RecognitionException("Mismatched Token","<AST>",-1,-1)
  , token(0)
  , node(node_)
  , tokenText( (node_ ? node_->toString(): ANTLR_USE_NAMESPACE(std)string("<empty tree>")) )
  , mismatchType(matchNot ? NOT_TOKEN : TOKEN)
  , expecting(expecting_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}